

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O2

void str_sanitize(char *str_in)

{
  byte bVar1;
  
  for (; bVar1 = *str_in, bVar1 != 0; str_in = (char *)((byte *)str_in + 1)) {
    if ((bVar1 < 0x20) && ((0xd < bVar1 || ((0x2600U >> (bVar1 & 0x1f) & 1) == 0)))) {
      *str_in = 0x20;
    }
  }
  return;
}

Assistant:

void str_sanitize(char *str_in)
{
	unsigned char *str = (unsigned char *)str_in;
	while(*str)
	{
		if(*str < 32 && !(*str == '\r') && !(*str == '\n') && !(*str == '\t'))
			*str = ' ';
		str++;
	}
}